

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::process_label(ldf *data,example *ec)

{
  float fVar1;
  wclass *pwVar2;
  ulong uVar3;
  long lVar4;
  features *pfVar5;
  features *pfVar6;
  size_t j;
  ulong uVar7;
  features new_fs;
  
  pfVar5 = (ec->super_example_predict).feature_space + *(ec->super_example_predict).indices._begin;
  pfVar6 = &new_fs;
  for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pfVar6->values)._begin = (pfVar5->values)._begin;
    pfVar5 = (features *)&(pfVar5->values)._end;
    pfVar6 = (features *)&(pfVar6->values)._end;
  }
  lVar4 = 0;
  for (uVar7 = 0; pwVar2 = (ec->l).cs.costs._begin,
      uVar7 < (ulong)((long)(ec->l).cs.costs._end - (long)pwVar2 >> 4); uVar7 = uVar7 + 1) {
    fVar1 = *(float *)((long)&pwVar2->x + lVar4);
    uVar3 = (ulong)fVar1;
    LabelDict::set_label_features
              (&data->label_features,(long)(fVar1 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3,
               &new_fs);
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void inline process_label(ldf& data, example* ec)
{
  auto new_fs = ec->feature_space[ec->indices[0]];
  auto& costs = ec->l.cs.costs;
  for (size_t j = 0; j < costs.size(); j++)
  {
    const auto lab = (size_t)costs[j].x;
    LabelDict::set_label_features(data.label_features, lab, new_fs);
  }
}